

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::anon_unknown_5::FindRedundantNodes::~FindRedundantNodes(FindRedundantNodes *this)

{
  (this->super_ConstVisitor).super_VisitorBase<true,_true>._vptr_VisitorBase =
       (_func_int **)&PTR_operator___001f1fc8;
  std::__cxx11::string::~string((string *)&this->identifier);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->unusedVars)._M_h);
  return;
}

Assistant:

FindRedundantNodes(
      std::unordered_set<ast::NodeID> &res,
      const std::unordered_map<ast::NodeID, std::shared_ptr<ast::Type>>
          &exprType,
      const std::unordered_set<std::string> &pureFunc)
      : res(res), exprType(exprType), pureFunc(pureFunc) {}